

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QNetworkCookie>::copyAppend
          (QGenericArrayOps<QNetworkCookie> *this,QNetworkCookie *b,QNetworkCookie *e)

{
  QNetworkCookie *pQVar1;
  long lVar2;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QNetworkCookie>).ptr;
    lVar2 = (this->super_QArrayDataPointer<QNetworkCookie>).size;
    do {
      QNetworkCookie::QNetworkCookie(pQVar1 + lVar2,b);
      b = b + 1;
      lVar2 = (this->super_QArrayDataPointer<QNetworkCookie>).size + 1;
      (this->super_QArrayDataPointer<QNetworkCookie>).size = lVar2;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }